

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDF_encryption.cc
# Opt level: O1

bool __thiscall QPDF::allowModifyAssembly(QPDF *this)

{
  bool bVar1;
  bool bVar2;
  int P;
  int R;
  encryption_method_e file;
  encryption_method_e string;
  encryption_method_e stream;
  int V;
  uint local_18;
  int local_14;
  encryption_method_e local_10;
  encryption_method_e local_c;
  encryption_method_e local_8;
  int local_4;
  
  local_14 = 0;
  local_18 = 0;
  bVar1 = isEncrypted(this,&local_14,(int *)&local_18,&local_4,&local_8,&local_c,&local_10);
  bVar2 = true;
  if (bVar1) {
    if (local_14 < 3) {
      bVar2 = SUB41((local_18 & 8) >> 3,0);
    }
    else {
      bVar2 = (bool)((byte)(local_18 >> 10) & 1);
    }
  }
  return bVar2;
}

Assistant:

bool
QPDF::allowModifyAssembly()
{
    int R = 0;
    int P = 0;
    bool status = true;
    if (isEncrypted(R, P)) {
        if (R < 3) {
            status = is_bit_set(P, 4);
        } else {
            status = is_bit_set(P, 11);
        }
    }
    return status;
}